

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * __thiscall cmGeneratorTarget::GetCustomObjectExtension(cmGeneratorTarget *this)

{
  cmMakefile *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  long lVar5;
  char *pcVar6;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  string local_40;
  
  if ((GetCustomObjectExtension()::modes == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetCustomObjectExtension()::modes), iVar3 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetCustomObjectExtension::modes,"CUDA_PTX_COMPILATION",
               (allocator<char> *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetCustomObjectExtension::modes._M_elems[0].extension,".ptx",&local_47);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(GetCustomObjectExtension::modes._M_elems + 1),"CUDA_CUBIN_COMPILATION",
               &local_41);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetCustomObjectExtension::modes._M_elems[1].extension,".cubin",&local_42);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(GetCustomObjectExtension::modes._M_elems + 2),"CUDA_FATBIN_COMPILATION",
               &local_43);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetCustomObjectExtension::modes._M_elems[2].extension,".fatbin",&local_44)
    ;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(GetCustomObjectExtension::modes._M_elems + 3),"CUDA_OPTIX_COMPILATION",
               &local_45);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetCustomObjectExtension::modes._M_elems[3].extension,".optixir",&local_46
              );
    __cxa_atexit(std::array<compiler_mode,_4UL>::~array,&GetCustomObjectExtension::modes,
                 &__dso_handle);
    __cxa_guard_release(&GetCustomObjectExtension()::modes);
  }
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_CUDA_COMPILER_ID",&local_47);
  psVar4 = cmMakefile::GetSafeDefinition(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (psVar4->_M_string_length == 0) {
    pcVar6 = (char *)0x0;
  }
  else {
    lVar1 = 0;
    do {
      lVar5 = lVar1;
      if (lVar5 == 0x100) {
        return (char *)0x0;
      }
      bVar2 = GetPropertyAsBool(this,(string *)
                                     ((long)&GetCustomObjectExtension::modes._M_elems[0].variable.
                                             _M_dataplus._M_p + lVar5));
      lVar1 = lVar5 + 0x40;
    } while (!bVar2);
    pcVar6 = *(char **)((long)&GetCustomObjectExtension::modes._M_elems[0].extension._M_dataplus.
                               _M_p + lVar5);
  }
  return pcVar6;
}

Assistant:

const char* cmGeneratorTarget::GetCustomObjectExtension() const
{
  struct compiler_mode
  {
    std::string variable;
    std::string extension;
  };
  static std::array<compiler_mode, 4> const modes{
    { { "CUDA_PTX_COMPILATION", ".ptx" },
      { "CUDA_CUBIN_COMPILATION", ".cubin" },
      { "CUDA_FATBIN_COMPILATION", ".fatbin" },
      { "CUDA_OPTIX_COMPILATION", ".optixir" } }
  };

  std::string const& compiler =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_COMPILER_ID");
  if (!compiler.empty()) {
    for (const auto& m : modes) {
      const bool has_extension = this->GetPropertyAsBool(m.variable);
      if (has_extension) {
        return m.extension.c_str();
      }
    }
  }
  return nullptr;
}